

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,Char16Ptr *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  UChar *array;
  int32_t len;
  UErrorCode *errorCode_local;
  int32_t destCapacity_local;
  Char16Ptr *dest_local;
  UnicodeString *this_local;
  
  this_local._4_4_ = length(this);
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    UVar1 = isBogus(this);
    if (((UVar1 == '\0') && (-1 < destCapacity)) &&
       ((destCapacity < 1 ||
        (pcVar2 = Char16Ptr::operator_cast_to_char16_t_(dest), pcVar2 != (char16_t *)0x0)))) {
      pcVar2 = getArrayStart(this);
      if (((0 < this_local._4_4_) && (this_local._4_4_ <= destCapacity)) &&
         (pcVar3 = Char16Ptr::operator_cast_to_char16_t_(dest), pcVar2 != pcVar3)) {
        pcVar3 = Char16Ptr::operator_cast_to_char16_t_(dest);
        u_memcpy_63(pcVar3,pcVar2,this_local._4_4_);
      }
      pcVar2 = Char16Ptr::operator_cast_to_char16_t_(dest);
      this_local._4_4_ = u_terminateUChars_63(pcVar2,destCapacity,this_local._4_4_,errorCode);
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UnicodeString::extract(Char16Ptr dest, int32_t destCapacity,
                       UErrorCode &errorCode) const {
  int32_t len = length();
  if(U_SUCCESS(errorCode)) {
    if(isBogus() || destCapacity<0 || (destCapacity>0 && dest==0)) {
      errorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else {
      const UChar *array = getArrayStart();
      if(len>0 && len<=destCapacity && array!=dest) {
        u_memcpy(dest, array, len);
      }
      return u_terminateUChars(dest, destCapacity, len, &errorCode);
    }
  }

  return len;
}